

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altsvc.c
# Opt level: O0

altsvc * altsvc_createid(char *srchost,size_t hlen,char *dsthost,size_t dlen,alpnid srcalpnid,
                        alpnid dstalpnid,size_t srcport,size_t dstport)

{
  altsvc *as_00;
  char *pcVar1;
  altsvc *as;
  alpnid dstalpnid_local;
  alpnid srcalpnid_local;
  size_t dlen_local;
  char *dsthost_local;
  size_t hlen_local;
  char *srchost_local;
  
  as_00 = (altsvc *)(*Curl_ccalloc)(1,0x50);
  if (as_00 == (altsvc *)0x0) {
    return (altsvc *)0x0;
  }
  if ((hlen != 0) && (dlen != 0)) {
    if ((hlen < 3) || (*srchost != '[')) {
      dsthost_local = (char *)hlen;
      hlen_local = (size_t)srchost;
      if ((srchost[hlen - 1] == '.') &&
         (dsthost_local = (char *)(hlen - 1), dsthost_local == (char *)0x0)) goto LAB_00112a6b;
    }
    else {
      hlen_local = (size_t)(srchost + 1);
      dsthost_local = (char *)(hlen - 2);
    }
    _dstalpnid_local = dlen;
    dlen_local = (size_t)dsthost;
    if ((2 < dlen) && (*dsthost == '[')) {
      dlen_local = (size_t)(dsthost + 1);
      _dstalpnid_local = dlen - 2;
    }
    pcVar1 = (char *)Curl_memdup0((char *)hlen_local,(size_t)dsthost_local);
    (as_00->src).host = pcVar1;
    if ((as_00->src).host != (char *)0x0) {
      pcVar1 = (char *)Curl_memdup0((char *)dlen_local,_dstalpnid_local);
      (as_00->dst).host = pcVar1;
      if ((as_00->dst).host != (char *)0x0) {
        (as_00->src).alpnid = srcalpnid;
        (as_00->dst).alpnid = dstalpnid;
        (as_00->src).port = (unsigned_short)srcport;
        (as_00->dst).port = (unsigned_short)dstport;
        return as_00;
      }
    }
  }
LAB_00112a6b:
  altsvc_free(as_00);
  return (altsvc *)0x0;
}

Assistant:

static struct altsvc *altsvc_createid(const char *srchost,
                                      size_t hlen,
                                      const char *dsthost,
                                      size_t dlen, /* dsthost length */
                                      enum alpnid srcalpnid,
                                      enum alpnid dstalpnid,
                                      size_t srcport,
                                      size_t dstport)
{
  struct altsvc *as = calloc(1, sizeof(struct altsvc));
  if(!as)
    return NULL;
  DEBUGASSERT(hlen);
  DEBUGASSERT(dlen);
  if(!hlen || !dlen)
    /* bad input */
    goto error;
  if((hlen > 2) && srchost[0] == '[') {
    /* IPv6 address, strip off brackets */
    srchost++;
    hlen -= 2;
  }
  else if(srchost[hlen - 1] == '.') {
    /* strip off trailing dot */
    hlen--;
    if(!hlen)
      goto error;
  }
  if((dlen > 2) && dsthost[0] == '[') {
    /* IPv6 address, strip off brackets */
    dsthost++;
    dlen -= 2;
  }

  as->src.host = Curl_memdup0(srchost, hlen);
  if(!as->src.host)
    goto error;

  as->dst.host = Curl_memdup0(dsthost, dlen);
  if(!as->dst.host)
    goto error;

  as->src.alpnid = srcalpnid;
  as->dst.alpnid = dstalpnid;
  as->src.port = (unsigned short)srcport;
  as->dst.port = (unsigned short)dstport;

  return as;
error:
  altsvc_free(as);
  return NULL;
}